

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_write_block(cram_fd *fd,cram_block *b)

{
  int iVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  byte *pbVar5;
  long lVar6;
  uchar *local_f8;
  uchar *local_e8;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  uint32_t crc;
  uchar *cp;
  uchar dat [100];
  cram_block *b_local;
  cram_fd *fd_local;
  
  unique0x100006b2 = b;
  if ((b->method == RAW) && (b->comp_size != b->uncomp_size)) {
    __assert_fail("b->method != RAW || (b->comp_size == b->uncomp_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x349,"int cram_write_block(cram_fd *, cram_block *)");
  }
  iVar1 = hputc(b->method,fd->fp);
  if (iVar1 == -1) {
    fd_local._4_4_ = -1;
  }
  else {
    iVar1 = hputc(stack0xffffffffffffffe0->content_type,fd->fp);
    if (iVar1 == -1) {
      fd_local._4_4_ = -1;
    }
    else {
      iVar1 = itf8_encode(fd,stack0xffffffffffffffe0->content_id);
      if (iVar1 == -1) {
        fd_local._4_4_ = -1;
      }
      else {
        iVar1 = itf8_encode(fd,stack0xffffffffffffffe0->comp_size);
        if (iVar1 == -1) {
          fd_local._4_4_ = -1;
        }
        else {
          iVar1 = itf8_encode(fd,stack0xffffffffffffffe0->uncomp_size);
          if (iVar1 == -1) {
            fd_local._4_4_ = -1;
          }
          else {
            if (stack0xffffffffffffffe0->method == RAW) {
              iVar1 = stack0xffffffffffffffe0->uncomp_size;
              sVar4 = hwrite(fd->fp,stack0xffffffffffffffe0->data,
                             (long)stack0xffffffffffffffe0->uncomp_size);
              if (iVar1 != sVar4) {
                return -1;
              }
            }
            else {
              iVar1 = stack0xffffffffffffffe0->comp_size;
              sVar4 = hwrite(fd->fp,stack0xffffffffffffffe0->data,
                             (long)stack0xffffffffffffffe0->comp_size);
              if (iVar1 != sVar4) {
                return -1;
              }
            }
            if (2 < fd->version >> 8) {
              cp._0_1_ = (undefined1)stack0xffffffffffffffe0->method;
              cp._1_1_ = (undefined1)stack0xffffffffffffffe0->content_type;
              if ((stack0xffffffffffffffe0->content_id & 0xffffff80U) == 0) {
                cp._2_1_ = (byte)stack0xffffffffffffffe0->content_id;
                local_ac = 1;
              }
              else {
                if ((stack0xffffffffffffffe0->content_id & 0xffffc000U) == 0) {
                  cp._2_1_ = (byte)((uint)stack0xffffffffffffffe0->content_id >> 8) | 0x80;
                  cp._3_1_ = (undefined1)stack0xffffffffffffffe0->content_id;
                  local_b0 = 2;
                }
                else {
                  if ((stack0xffffffffffffffe0->content_id & 0xffe00000U) == 0) {
                    cp._2_1_ = (byte)((uint)stack0xffffffffffffffe0->content_id >> 0x10) | 0xc0;
                    cp._3_1_ = (undefined1)((uint)stack0xffffffffffffffe0->content_id >> 8);
                    cp._4_1_ = (undefined1)stack0xffffffffffffffe0->content_id;
                    local_b4 = 3;
                  }
                  else {
                    if ((stack0xffffffffffffffe0->content_id & 0xf0000000U) == 0) {
                      cp._2_1_ = (byte)((uint)stack0xffffffffffffffe0->content_id >> 0x18) | 0xe0;
                      cp._3_1_ = (undefined1)((uint)stack0xffffffffffffffe0->content_id >> 0x10);
                      cp._4_1_ = (undefined1)((uint)stack0xffffffffffffffe0->content_id >> 8);
                      cp._5_1_ = (undefined1)stack0xffffffffffffffe0->content_id;
                      local_b8 = 4;
                    }
                    else {
                      cp._2_1_ = (byte)(stack0xffffffffffffffe0->content_id >> 0x1c) | 0xf0;
                      cp._3_1_ = (undefined1)(stack0xffffffffffffffe0->content_id >> 0x14);
                      cp._4_1_ = (undefined1)(stack0xffffffffffffffe0->content_id >> 0xc);
                      cp._5_1_ = (undefined1)(stack0xffffffffffffffe0->content_id >> 4);
                      cp._6_1_ = (byte)stack0xffffffffffffffe0->content_id & 0xf;
                      local_b8 = 5;
                    }
                    local_b4 = local_b8;
                  }
                  local_b0 = local_b4;
                }
                local_ac = local_b0;
              }
              lVar6 = (long)local_ac;
              pbVar5 = dat + lVar6 + -6;
              if ((stack0xffffffffffffffe0->comp_size & 0xffffff80U) == 0) {
                *pbVar5 = (byte)stack0xffffffffffffffe0->comp_size;
                local_bc = 1;
              }
              else {
                if ((stack0xffffffffffffffe0->comp_size & 0xffffc000U) == 0) {
                  *pbVar5 = (byte)((uint)stack0xffffffffffffffe0->comp_size >> 8) | 0x80;
                  dat[lVar6 + -5] = (uchar)stack0xffffffffffffffe0->comp_size;
                  local_c0 = 2;
                }
                else {
                  if ((stack0xffffffffffffffe0->comp_size & 0xffe00000U) == 0) {
                    *pbVar5 = (byte)((uint)stack0xffffffffffffffe0->comp_size >> 0x10) | 0xc0;
                    dat[lVar6 + -5] = (uchar)((uint)stack0xffffffffffffffe0->comp_size >> 8);
                    dat[lVar6 + -4] = (uchar)stack0xffffffffffffffe0->comp_size;
                    local_c4 = 3;
                  }
                  else {
                    if ((stack0xffffffffffffffe0->comp_size & 0xf0000000U) == 0) {
                      *pbVar5 = (byte)((uint)stack0xffffffffffffffe0->comp_size >> 0x18) | 0xe0;
                      dat[lVar6 + -5] = (uchar)((uint)stack0xffffffffffffffe0->comp_size >> 0x10);
                      dat[lVar6 + -4] = (uchar)((uint)stack0xffffffffffffffe0->comp_size >> 8);
                      dat[lVar6 + -3] = (uchar)stack0xffffffffffffffe0->comp_size;
                      local_c8 = 4;
                    }
                    else {
                      *pbVar5 = (byte)(stack0xffffffffffffffe0->comp_size >> 0x1c) | 0xf0;
                      dat[lVar6 + -5] = (uchar)(stack0xffffffffffffffe0->comp_size >> 0x14);
                      dat[lVar6 + -4] = (uchar)(stack0xffffffffffffffe0->comp_size >> 0xc);
                      dat[lVar6 + -3] = (uchar)(stack0xffffffffffffffe0->comp_size >> 4);
                      dat[lVar6 + -2] = (byte)stack0xffffffffffffffe0->comp_size & 0xf;
                      local_c8 = 5;
                    }
                    local_c4 = local_c8;
                  }
                  local_c0 = local_c4;
                }
                local_bc = local_c0;
              }
              pbVar5 = pbVar5 + local_bc;
              if ((stack0xffffffffffffffe0->uncomp_size & 0xffffff80U) == 0) {
                *pbVar5 = (byte)stack0xffffffffffffffe0->uncomp_size;
                local_cc = 1;
              }
              else {
                if ((stack0xffffffffffffffe0->uncomp_size & 0xffffc000U) == 0) {
                  *pbVar5 = (byte)((uint)stack0xffffffffffffffe0->uncomp_size >> 8) | 0x80;
                  pbVar5[1] = (byte)stack0xffffffffffffffe0->uncomp_size;
                  local_d0 = 2;
                }
                else {
                  if ((stack0xffffffffffffffe0->uncomp_size & 0xffe00000U) == 0) {
                    *pbVar5 = (byte)((uint)stack0xffffffffffffffe0->uncomp_size >> 0x10) | 0xc0;
                    pbVar5[1] = (byte)((uint)stack0xffffffffffffffe0->uncomp_size >> 8);
                    pbVar5[2] = (byte)stack0xffffffffffffffe0->uncomp_size;
                    local_d4 = 3;
                  }
                  else {
                    if ((stack0xffffffffffffffe0->uncomp_size & 0xf0000000U) == 0) {
                      *pbVar5 = (byte)((uint)stack0xffffffffffffffe0->uncomp_size >> 0x18) | 0xe0;
                      pbVar5[1] = (byte)((uint)stack0xffffffffffffffe0->uncomp_size >> 0x10);
                      pbVar5[2] = (byte)((uint)stack0xffffffffffffffe0->uncomp_size >> 8);
                      pbVar5[3] = (byte)stack0xffffffffffffffe0->uncomp_size;
                      local_d8 = 4;
                    }
                    else {
                      *pbVar5 = (byte)(stack0xffffffffffffffe0->uncomp_size >> 0x1c) | 0xf0;
                      pbVar5[1] = (byte)(stack0xffffffffffffffe0->uncomp_size >> 0x14);
                      pbVar5[2] = (byte)(stack0xffffffffffffffe0->uncomp_size >> 0xc);
                      pbVar5[3] = (byte)(stack0xffffffffffffffe0->uncomp_size >> 4);
                      pbVar5[4] = (byte)stack0xffffffffffffffe0->uncomp_size & 0xf;
                      local_d8 = 5;
                    }
                    local_d4 = local_d8;
                  }
                  local_d0 = local_d4;
                }
                local_cc = local_d0;
              }
              uVar2 = crc32(0,&cp,(ulong)(pbVar5 + ((long)local_cc - (long)&cp)) & 0xffffffff);
              if (stack0xffffffffffffffe0->method == RAW) {
                if (stack0xffffffffffffffe0->data == (uchar *)0x0) {
                  local_e8 = "";
                }
                else {
                  local_e8 = stack0xffffffffffffffe0->data;
                }
                uVar3 = crc32(uVar2,local_e8,stack0xffffffffffffffe0->uncomp_size);
                stack0xffffffffffffffe0->crc32 = uVar3;
              }
              else {
                if (stack0xffffffffffffffe0->data == (uchar *)0x0) {
                  local_f8 = "";
                }
                else {
                  local_f8 = stack0xffffffffffffffe0->data;
                }
                uVar3 = crc32(uVar2,local_f8,stack0xffffffffffffffe0->comp_size);
                stack0xffffffffffffffe0->crc32 = uVar3;
              }
              iVar1 = int32_encode(fd,stack0xffffffffffffffe0->crc32);
              if (iVar1 == -1) {
                return -1;
              }
            }
            fd_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return fd_local._4_4_;
}

Assistant:

int cram_write_block(cram_fd *fd, cram_block *b) {
    assert(b->method != RAW || (b->comp_size == b->uncomp_size));

    if (hputc(b->method,       fd->fp)  == EOF) return -1;
    if (hputc(b->content_type, fd->fp)  == EOF) return -1;
    if (itf8_encode(fd, b->content_id)  ==  -1) return -1;
    if (itf8_encode(fd, b->comp_size)   ==  -1) return -1;
    if (itf8_encode(fd, b->uncomp_size) ==  -1) return -1;

    if (b->method == RAW) {
	if (b->uncomp_size != hwrite(fd->fp, b->data, b->uncomp_size))
	    return -1;
    } else {
	if (b->comp_size != hwrite(fd->fp, b->data, b->comp_size))
	    return -1;
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	unsigned char dat[100], *cp = dat;;
	uint32_t crc;

	*cp++ = b->method;
	*cp++ = b->content_type;
	cp += itf8_put(cp, b->content_id);
	cp += itf8_put(cp, b->comp_size);
	cp += itf8_put(cp, b->uncomp_size);
	crc = crc32(0L, dat, cp-dat);

	if (b->method == RAW) {
	    b->crc32 = crc32(crc, b->data ? b->data : (uc*)"", b->uncomp_size);
	} else {
	    b->crc32 = crc32(crc, b->data ? b->data : (uc*)"", b->comp_size);
	}

	if (-1 == int32_encode(fd, b->crc32))
	    return -1;
    }

    return 0;
}